

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  uint16_t uVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *__ptr;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *v;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_00;
  
  uVar1 = (this->data_).f.flags;
  if (uVar1 == 3) {
    DoFreeMembers(this);
    return;
  }
  if (uVar1 == 0xc05) {
    __ptr = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
            ((ulong)(this->data_).s.str & 0xffffffffffff);
  }
  else {
    if (uVar1 != 4) {
      return;
    }
    __ptr = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
            ((ulong)(this->data_).s.str & 0xffffffffffff);
    for (this_00 = __ptr; this_00 != __ptr + (this->data_).s.length; this_00 = this_00 + 1) {
      ~GenericValue(this_00);
    }
  }
  free(__ptr);
  return;
}

Assistant:

~GenericValue() {
        // With RAPIDJSON_USE_MEMBERSMAP, the maps need to be destroyed to release
        // their Allocator if it's refcounted (e.g. MemoryPoolAllocator).
        if (Allocator::kNeedFree || (RAPIDJSON_USE_MEMBERSMAP+0 &&
                                     internal::IsRefCounted<Allocator>::Value)) {
            switch(data_.f.flags) {
            case kArrayFlag:
                {
                    GenericValue* e = GetElementsPointer();
                    for (GenericValue* v = e; v != e + data_.a.size; ++v)
                        v->~GenericValue();
                    if (Allocator::kNeedFree) { // Shortcut by Allocator's trait
                        Allocator::Free(e);
                    }
                }
                break;

            case kObjectFlag:
                DoFreeMembers();
                break;

            case kCopyStringFlag:
                if (Allocator::kNeedFree) { // Shortcut by Allocator's trait
                    Allocator::Free(const_cast<Ch*>(GetStringPointer()));
                }
                break;

            default:
                break;  // Do nothing for other types.
            }
        }
    }